

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,ArrayPtr<const_char> *first,CappedArray<char,_14UL> *rest,
                 ArrayPtr<const_char> *rest_1,StringPtr *rest_2,ArrayPtr<const_char> *rest_3,
                 ArrayPtr<const_char> *rest_4,FixedArray<char,_1UL> *rest_5)

{
  size_t sVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    pcVar2 = first->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  __n = rest->currentSize;
  if (__n != 0) {
    memcpy(target,rest->content,__n);
    target = target + __n;
  }
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                     (target,rest_1,rest_2,rest_3,rest_4,rest_5);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}